

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O0

bool __thiscall QGraphicsProxyWidget::focusNextPrevChild(QGraphicsProxyWidget *this,bool next)

{
  bool bVar1;
  undefined4 uVar2;
  QGraphicsProxyWidgetPrivate *pQVar3;
  QWidget *pQVar4;
  byte in_SIL;
  QWidget *unaff_retaddr;
  QWidget *newFocusChild;
  QWidget *lastFocusChild;
  FocusReason reason;
  QGraphicsProxyWidgetPrivate *d;
  undefined8 in_stack_ffffffffffffffd0;
  undefined1 uVar5;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  FocusReason in_stack_fffffffffffffffc;
  
  uVar5 = (undefined1)((ulong)in_stack_ffffffffffffffd0 >> 0x38);
  pQVar3 = d_func((QGraphicsProxyWidget *)0x9bdca5);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x9bdcbb);
  if ((bVar1) &&
     ((pQVar3->super_QGraphicsWidgetPrivate).super_QGraphicsItemPrivate.scene !=
      (QGraphicsScene *)0x0)) {
    uVar2 = 2;
    if ((in_SIL & 1) != 0) {
      uVar2 = 1;
    }
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9bdd17);
    pQVar4 = QWidget::focusWidget((QWidget *)0x9bdd1f);
    uVar5 = (undefined1)((ulong)pQVar4 >> 0x38);
    pQVar4 = QGraphicsProxyWidgetPrivate::findFocusChild
                       ((QGraphicsProxyWidgetPrivate *)lastFocusChild,(QWidget *)d,
                        newFocusChild._7_1_);
    if (pQVar4 == (QWidget *)0x0) {
      bVar1 = QGraphicsWidget::focusNextPrevChild
                        ((QWindow *)CONCAT44(uVar2,in_stack_ffffffffffffffd8),(bool)uVar5);
    }
    else {
      QWidget::setFocus(unaff_retaddr,in_stack_fffffffffffffffc);
      bVar1 = true;
    }
  }
  else {
    bVar1 = QGraphicsWidget::focusNextPrevChild
                      ((QWindow *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       (bool)uVar5);
  }
  return bVar1;
}

Assistant:

bool QGraphicsProxyWidget::focusNextPrevChild(bool next)
{
    Q_D(QGraphicsProxyWidget);
    if (!d->widget || !d->scene)
        return QGraphicsWidget::focusNextPrevChild(next);

    Qt::FocusReason reason = next ? Qt::TabFocusReason : Qt::BacktabFocusReason;
    QWidget *lastFocusChild = d->widget->focusWidget();
    if (QWidget *newFocusChild = d->findFocusChild(lastFocusChild, next)) {
        newFocusChild->setFocus(reason);
        return true;
    }

    return QGraphicsWidget::focusNextPrevChild(next);
}